

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.h
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<test_host>::construct<test_host,test_host>
          (new_allocator<test_host> *this,test_host *__p,test_host *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  offset_in_test_fixture_to_subr oVar4;
  undefined8 uVar5;
  
  *(undefined8 *)&__p->field_0x10 = *(undefined8 *)&__args->field_0x10;
  oVar4 = __args->test;
  __p->fixture = __args->fixture;
  __p->test = oVar4;
  paVar1 = &(__p->test_name).field_2;
  (__p->test_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->test_name)._M_dataplus._M_p;
  paVar2 = &(__args->test_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(__args->test_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->test_name).field_2 + 8) = uVar5;
  }
  else {
    (__p->test_name)._M_dataplus._M_p = pcVar3;
    (__p->test_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->test_name)._M_string_length = (__args->test_name)._M_string_length;
  (__args->test_name)._M_dataplus._M_p = (pointer)paVar2;
  (__args->test_name)._M_string_length = 0;
  (__args->test_name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__p->exception_msg).field_2;
  (__p->exception_msg)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->exception_msg)._M_dataplus._M_p;
  paVar2 = &(__args->exception_msg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(__args->exception_msg).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->exception_msg).field_2 + 8) = uVar5;
  }
  else {
    (__p->exception_msg)._M_dataplus._M_p = pcVar3;
    (__p->exception_msg).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->exception_msg)._M_string_length = (__args->exception_msg)._M_string_length;
  (__args->exception_msg)._M_dataplus._M_p = (pointer)paVar2;
  (__args->exception_msg)._M_string_length = 0;
  (__args->exception_msg).field_2._M_local_buf[0] = '\0';
  __p->passed = __args->passed;
  return;
}

Assistant:

test_host() :
        fixture(),
        test(nullptr),
        test_name(),
        exception_msg(),
        passed(false)
    {
    }